

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_expr.cpp
# Opt level: O1

void Cmd_eval(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  int iVar2;
  FProduction *block;
  char *pcVar3;
  FBaseCVar *this;
  FProduction *pFVar4;
  ECVarType type;
  int parsept;
  UCVarValue val;
  int local_24;
  UCVarValue local_20;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 < 2) goto LAB_0035ac3e;
  local_24 = 1;
  block = ParseExpression(argv,&local_24);
  iVar1 = local_24;
  if (block == (FProduction *)0x0) goto LAB_0035ac3e;
  iVar2 = FCommandLine::argc(argv);
  if (iVar1 < iVar2) {
    pcVar3 = FCommandLine::operator[](argv,local_24);
    this = FindCVar(pcVar3,(FBaseCVar **)0x0);
    if (this == (FBaseCVar *)0x0) {
      pFVar4 = (FProduction *)FCommandLine::operator[](argv,local_24);
      pcVar3 = "Unknown variable %s\n";
LAB_0035ac12:
      Printf(pcVar3,pFVar4);
    }
    else {
      if (block->Type == PROD_Double) {
        local_20.Float = (float)*(double *)(block + 2);
        type = CVAR_Float;
      }
      else {
        local_20.String = (char *)(block + 1);
        type = CVAR_String;
      }
      FBaseCVar::SetGenericRep(this,local_20,type);
    }
  }
  else {
    if (block->Type != PROD_Double) {
      pFVar4 = block + 1;
      pcVar3 = "%s\n";
      goto LAB_0035ac12;
    }
    Printf("%g\n",*(undefined8 *)(block + 2));
  }
  M_Free(block);
  if (block != (FProduction *)0x0) {
    return;
  }
LAB_0035ac3e:
  Printf("Usage: eval <expression> [variable]\n");
  return;
}

Assistant:

CCMD (eval)
{
	if (argv.argc() >= 2)
	{
		int parsept = 1;
		FProduction *prod = ParseExpression (argv, parsept);

		if (prod != NULL)
		{
			if (parsept < argv.argc())
			{
				FBaseCVar *var = FindCVar (argv[parsept], NULL);
				if (var == NULL)
				{
					Printf ("Unknown variable %s\n", argv[parsept]);
				}
				else
				{
					UCVarValue val;

					if (prod->Type == PROD_Double)
					{
						val.Float = (float)static_cast<FDoubleProd *>(prod)->Value;
						var->SetGenericRep (val, CVAR_Float);
					}
					else
					{
						val.String = static_cast<FStringProd *>(prod)->Value;
						var->SetGenericRep (val, CVAR_String);
					}
				}
			}
			else
			{
				if (prod->Type == PROD_Double)
				{
					Printf ("%g\n", static_cast<FDoubleProd *>(prod)->Value);
				}
				else
				{
					Printf ("%s\n", static_cast<FStringProd *>(prod)->Value);
				}
			}
			M_Free (prod);
			return;
		}
	}

	Printf ("Usage: eval <expression> [variable]\n");
}